

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.cpp
# Opt level: O2

int pk_hashlen_helper(mbedtls_md_type_t md_alg,size_t *hash_len)

{
  byte bVar1;
  
  if (*hash_len != 0) {
    return 0;
  }
  bVar1 = mbedtls_md_get_size_from_type(md_alg);
  *hash_len = (ulong)bVar1;
  return -(uint)(bVar1 == 0);
}

Assistant:

inline int pk_hashlen_helper(mbedtls_md_type_t md_alg, size_t *hash_len)
{
    if (*hash_len != 0) {
        return 0;
    }

    *hash_len = mbedtls_md_get_size_from_type(md_alg);

    if (*hash_len == 0) {
        return -1;
    }

    return 0;
}